

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O0

bool __thiscall lexical::analyse_char(lexical *this,iterator *it,Meta *m)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  Symbol local_160;
  undefined1 local_138 [8];
  Token t;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  undefined4 local_90;
  allocator local_89;
  string local_88;
  int local_58;
  int local_54;
  int countO;
  int countU;
  string buf;
  int state;
  Meta *m_local;
  iterator *it_local;
  lexical *this_local;
  
  buf.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)&countO);
  local_54 = 0;
  local_58 = 0;
  do {
    bVar1 = __gnu_cxx::operator!=(it,&m->end);
    if (!bVar1) {
      this_local._7_1_ = false;
      local_90 = 1;
LAB_00121a37:
      std::__cxx11::string::~string((string *)&countO);
      return this_local._7_1_;
    }
    switch(buf.field_2._12_4_) {
    case 0:
      buf.field_2._12_4_ = 1;
      break;
    case 1:
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(it);
      if (*pcVar3 == '\\') {
        buf.field_2._12_4_ = 3;
      }
      else {
        buf.field_2._12_4_ = 2;
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(it);
      std::__cxx11::string::push_back((char)&countO);
      break;
    case 2:
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(it);
      if (*pcVar3 != '\'') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_88,anon_var_dwarf_20aae,&local_89);
        error(this,it,m,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        this_local._7_1_ = false;
        local_90 = 1;
        goto LAB_00121a37;
      }
      buf.field_2._12_4_ = 6;
      break;
    case 3:
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(it);
      std::__cxx11::string::push_back((char)&countO);
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(it);
      bVar1 = Table::in_escape_chars(&this->table,pcVar3);
      if (bVar1) {
        buf.field_2._12_4_ = 2;
      }
      else {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(it);
        if (*pcVar3 == 'u') {
          buf.field_2._12_4_ = 4;
        }
        else {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(it);
          bVar1 = sutil::is_octal(pcVar3);
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_b0,anon_var_dwarf_20ac5,&local_b1);
            error(this,it,m,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_b1);
            this_local._7_1_ = false;
            local_90 = 1;
            goto LAB_00121a37;
          }
          buf.field_2._12_4_ = 5;
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator--(it);
          std::__cxx11::string::pop_back();
        }
      }
      break;
    case 4:
      if (local_54 < 4) {
        local_54 = local_54 + 1;
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(it);
        iVar2 = isxdigit((int)*pcVar3);
        if (iVar2 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_d8,anon_var_dwarf_20ad0,&local_d9);
          error(this,it,m,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_d9);
          this_local._7_1_ = false;
          local_90 = 1;
          goto LAB_00121a37;
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(it);
        std::__cxx11::string::push_back((char)&countO);
      }
      else {
        local_54 = local_54 + 1;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--(it);
        buf.field_2._12_4_ = 2;
      }
      break;
    case 5:
      if (local_58 < 3) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(it);
        bVar1 = sutil::is_octal(pcVar3);
        if (bVar1) {
          local_58 = local_58 + 1;
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(it);
          std::__cxx11::string::push_back((char)&countO);
        }
        else {
          if (local_58 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_100,anon_var_dwarf_20ae7,
                       (allocator *)(t.name.field_2._M_local_buf + 0xf));
            error(this,it,m,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::allocator<char>::~allocator((allocator<char> *)(t.name.field_2._M_local_buf + 0xf))
            ;
            this_local._7_1_ = false;
            local_90 = 1;
            goto LAB_00121a37;
          }
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator--(it);
          buf.field_2._12_4_ = 2;
        }
      }
      else {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--(it);
        buf.field_2._12_4_ = 2;
      }
      break;
    case 6:
      Token::Token((Token *)local_138,m->line,m->column,7,(string *)&countO);
      std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,(value_type *)local_138);
      Symbol::Symbol(&local_160,t.row,(string *)&t.type);
      std::set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_>::insert
                (&this->symbols,&local_160);
      Symbol::~Symbol(&local_160);
      this_local._7_1_ = true;
      local_90 = 1;
      Token::~Token((Token *)local_138);
      goto LAB_00121a37;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(it);
  } while( true );
}

Assistant:

bool lexical::analyse_char(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;
    int countU = 0;
    int countO = 0;
    while (it != m.end) {
        switch (state) {
            case 0: {
                state = 1;
                break;
            }
            case 1: {
                if (*it == '\\')
                    state = 3;
                else
                    state = 2;
                buf.push_back(*it);
                break;
            }
                //分析普通字符
            case 2: {
                if (*it != '\'') {
                    error(it, m, "非法的字符结尾");
                    return false;
                }
                state = 6;
                break;
            }
                //分析普通转义字符
            case 3: {
                buf.push_back(*it);
                if (table.in_escape_chars(*it)) {
                    state = 2;
                } else if (*it == 'u') {
                    state = 4;
                } else if (sutil::is_octal(*it)) {
                    state = 5;
                    --it;
                    buf.pop_back();
                } else {
                    error(it, m, "非法的转义字符");
                    return false;
                }
                break;
            }
                // 分析\uFFFF
            case 4: {
                if (countU++ < 4) {
                    if (isxdigit(*it))buf.push_back(*it);
                    else {
                        error(it, m, "unicode表示法需要4位16进制数");
                        return false;
                    }
                } else {
                    --it;
                    state = 2;
                }
                break;
            }
                //分析 \八进制*3
            case 5: {
                if (countO < 3) {
                    if (sutil::is_octal(*it)) {
                        ++countO;
                        buf.push_back(*it);
                    } else if (countO != 0) {
                        --it;
                        state = 2;
                    } else {
                        error(it, m, "八进制字符需要1-3位八进制数");
                        return false;
                    }
                } else {
                    --it;
                    state = 2;
                }
                break;
            }
            case 6: {
                Token t(m.line, m.column, Token::CHAR, buf);
                tokens.push_back(t);
                symbols.insert(Symbol(t.type, t.name));
                return true;
            }
        }
        ++it;
    }
    return false;
}